

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O0

void Assimp::IFC::ProcessBooleanHalfSpaceDifference
               (IfcHalfSpaceSolid *hs,TempMesh *result,TempMesh *first_operand,
               ConversionData *param_4)

{
  bool bVar1;
  IfcSurface *pIVar2;
  IfcPlane *pIVar3;
  IfcAxis2Placement3D *pIVar4;
  Lazy *this;
  IfcDirection *in_00;
  IfcCartesianPoint *in_01;
  const_iterator cVar5;
  size_type sVar6;
  const_reference pvVar7;
  reference puVar8;
  const_reference pvVar9;
  reference paVar10;
  difference_type dVar11;
  reference b;
  uint uVar12;
  double dVar13;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_208;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_200;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_1f8;
  aiVector3t<double> *local_1f0;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_1e8;
  const_iterator local_1e0;
  const_iterator local_1d8;
  aiVector3t<double> *local_1d0;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_1c8;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_1c0;
  aiVector3t<double> *local_1b8;
  aiVector3t<double> *local_1b0;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_1a8;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_1a0;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_198;
  iterator e;
  FuzzyVectorCompare fz;
  IfcFloat epsilon;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_160;
  undefined1 local_158 [8];
  IfcVector3 vmax;
  IfcVector3 vmin;
  IfcVector3 isectpos;
  IfcVector3 e1;
  IfcVector3 *e0;
  undefined1 local_e8 [4];
  uint i;
  byte local_c9;
  value_type_conflict4 local_c8;
  uint uStack_c4;
  bool isAtWhiteSide;
  uint newcount;
  uint vidx;
  const_iterator iit;
  const_iterator end;
  const_iterator begin;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *outvert;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *in;
  ENUMERATION local_88;
  undefined1 local_60 [8];
  IfcVector3 n;
  IfcVector3 p;
  IfcPlane *plane;
  ConversionData *param_3_local;
  TempMesh *first_operand_local;
  TempMesh *result_local;
  IfcHalfSpaceSolid *hs_local;
  
  if (hs == (IfcHalfSpaceSolid *)0x0) {
    __assert_fail("hs != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCBoolean.cpp"
                  ,0x8f,
                  "void Assimp::IFC::ProcessBooleanHalfSpaceDifference(const Schema_2x3::IfcHalfSpaceSolid *, TempMesh &, const TempMesh &, ConversionData &)"
                 );
  }
  pIVar2 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcSurface>::operator->
                     ((Lazy<Assimp::IFC::Schema_2x3::IfcSurface> *)
                      &(hs->super_IfcGeometricRepresentationItem).field_0x30);
  pIVar3 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcPlane>
                     ((Object *)
                      ((long)&(pIVar2->super_IfcGeometricRepresentationItem).
                              super_IfcRepresentationItem.
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper +
                      (long)(pIVar2->super_IfcGeometricRepresentationItem).
                            super_IfcRepresentationItem.
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                            _vptr_ObjectHelper[-3]));
  if (pIVar3 == (IfcPlane *)0x0) {
    LogFunctions<Assimp::IFCImporter>::LogError
              ("expected IfcPlane as base surface for the IfcHalfSpaceSolid");
  }
  else {
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)&n.z);
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)local_60,0.0,0.0,1.0);
    pIVar4 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::operator->
                       ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D> *)
                        &(pIVar3->super_IfcElementarySurface).super_IfcSurface.field_0x40);
    bVar1 = STEP::Maybe::operator_cast_to_bool((Maybe *)&(pIVar4->super_IfcPlacement).field_0x48);
    if (bVar1) {
      pIVar4 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::operator->
                         ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D> *)
                          &(pIVar3->super_IfcElementarySurface).super_IfcSurface.field_0x40);
      this = (Lazy *)STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Get
                               ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *
                                )&(pIVar4->super_IfcPlacement).field_0x48);
      in_00 = STEP::Lazy::operator_cast_to_IfcDirection_(this);
      ConvertDirection((IfcVector3 *)local_60,in_00);
    }
    pIVar4 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::operator->
                       ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D> *)
                        &(pIVar3->super_IfcElementarySurface).super_IfcSurface.field_0x40);
    in_01 = STEP::Lazy::operator_cast_to_IfcCartesianPoint_
                      ((Lazy *)&(pIVar4->super_IfcPlacement).super_IfcGeometricRepresentationItem.
                                field_0x30);
    ConvertCartesianPoint((IfcVector3 *)&n.z,in_01);
    STEP::EXPRESS::ENUMERATION::ENUMERATION(&local_88,&hs->AgreementFlag);
    bVar1 = IsTrue(&local_88);
    STEP::EXPRESS::ENUMERATION::~ENUMERATION(&local_88);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      aiVector3t<double>::operator*=((aiVector3t<double> *)local_60,-1.0);
    }
    cVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                      (&first_operand->mVertcnt);
    iit = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&first_operand->mVertcnt);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::__normal_iterator((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         *)&newcount);
    sVar6 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                      (&first_operand->mVerts);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&result->mVerts,sVar6);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&first_operand->mVertcnt)
    ;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&result->mVertcnt,sVar6);
    uStack_c4 = 0;
    _newcount = cVar5;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)&newcount,&iit), bVar1) {
      local_c8 = 0;
      pvVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                         (&first_operand->mVerts,(ulong)uStack_c4);
      ::operator-((aiVector3t<double> *)local_e8,pvVar7,(aiVector3t<double> *)&n.z);
      dVar13 = ::operator*((aiVector3t<double> *)local_e8,(aiVector3t<double> *)local_60);
      local_c9 = -1e-06 < dVar13;
      for (e0._4_4_ = 0;
          puVar8 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&newcount), e0._4_4_ < *puVar8; e0._4_4_ = e0._4_4_ + 1) {
        pvVar7 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                           (&first_operand->mVerts,(ulong)(uStack_c4 + e0._4_4_));
        uVar12 = uStack_c4;
        puVar8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&newcount);
        pvVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                           (&first_operand->mVerts,(ulong)(uVar12 + (e0._4_4_ + 1) % *puVar8));
        isectpos.z = pvVar9->x;
        aiVector3t<double>::aiVector3t((aiVector3t<double> *)&vmin.z);
        bVar1 = IntersectSegmentPlane
                          ((IfcVector3 *)&n.z,(IfcVector3 *)local_60,pvVar7,
                           (IfcVector3 *)&isectpos.z,(bool)(local_c9 & 1),(IfcVector3 *)&vmin.z);
        if (bVar1) {
          if ((local_c9 & 1) == 0) {
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&result->mVerts,(value_type *)&vmin.z);
            local_c8 = local_c8 + 1;
          }
          else {
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&result->mVerts,pvVar7);
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&result->mVerts,(value_type *)&vmin.z);
            local_c8 = local_c8 + 2;
          }
          local_c9 = (local_c9 ^ 0xff) & 1;
        }
        else if ((local_c9 & 1) != 0) {
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    (&result->mVerts,pvVar7);
          local_c8 = local_c8 + 1;
        }
      }
      if (local_c8 != 0) {
        aiVector3t<double>::aiVector3t((aiVector3t<double> *)&vmax.z);
        aiVector3t<double>::aiVector3t((aiVector3t<double> *)local_158);
        epsilon = (IfcFloat)
                  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                            (&result->mVerts);
        local_160 = __gnu_cxx::
                    __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                    ::operator-((__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                 *)&epsilon,(ulong)local_c8);
        paVar10 = __gnu_cxx::
                  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                  ::operator*(&local_160);
        ArrayBounds<aiVector3t<double>>
                  (paVar10,local_c8,(aiVector3t<double> *)&vmax.z,(aiVector3t<double> *)local_158);
        ::operator-((aiVector3t<double> *)&fz,(aiVector3t<double> *)local_158,
                    (aiVector3t<double> *)&vmax.z);
        dVar13 = aiVector3t<double>::SquareLength((aiVector3t<double> *)&fz);
        FuzzyVectorCompare::FuzzyVectorCompare((FuzzyVectorCompare *)&e,dVar13 / 1000000.0);
        local_1a8._M_current =
             (aiVector3t<double> *)
             std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                       (&result->mVerts);
        local_1a0 = __gnu_cxx::
                    __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                    ::operator-(&local_1a8,(ulong)local_c8);
        local_1b0 = (aiVector3t<double> *)
                    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                              (&result->mVerts);
        local_1b8 = e._M_current;
        local_198 = std::
                    unique<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,Assimp::IFC::FuzzyVectorCompare>
                              (local_1a0,
                               (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                )local_1b0,e._M_current);
        local_1c0._M_current =
             (aiVector3t<double> *)
             std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                       (&result->mVerts);
        bVar1 = __gnu_cxx::operator!=(&local_198,&local_1c0);
        if (bVar1) {
          local_1c8._M_current = local_198._M_current;
          local_1d0 = (aiVector3t<double> *)
                      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                                (&result->mVerts);
          dVar11 = std::
                   distance<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                             (local_1c8,
                              (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                               )local_1d0);
          local_c8 = local_c8 - (int)dVar11;
          __gnu_cxx::
          __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
          ::__normal_iterator<aiVector3t<double>*>
                    ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                      *)&local_1d8,&local_198);
          local_1e8._M_current =
               (aiVector3t<double> *)
               std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                         (&result->mVerts);
          __gnu_cxx::
          __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
          ::__normal_iterator<aiVector3t<double>*>
                    ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                      *)&local_1e0,&local_1e8);
          local_1f0 = (aiVector3t<double> *)
                      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::erase
                                (&result->mVerts,local_1d8,local_1e0);
        }
        local_200._M_current =
             (aiVector3t<double> *)
             std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                       (&result->mVerts);
        local_1f8 = __gnu_cxx::
                    __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                    ::operator-(&local_200,(ulong)local_c8);
        paVar10 = __gnu_cxx::
                  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                  ::operator*(&local_1f8);
        b = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::back
                      (&result->mVerts);
        bVar1 = FuzzyVectorCompare::operator()((FuzzyVectorCompare *)&e,paVar10,b);
        if (bVar1) {
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::pop_back
                    (&result->mVerts);
          local_c8 = local_c8 - 1;
        }
        if (local_c8 < 3) {
          while (uVar12 = local_c8 - 1, bVar1 = local_c8 != 0, local_c8 = uVar12, bVar1) {
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::pop_back
                      (&result->mVerts);
          }
        }
        else {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&result->mVertcnt,&local_c8);
        }
      }
      local_208 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&newcount,0);
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_208);
      uStack_c4 = *puVar8 + uStack_c4;
    }
    LogFunctions<Assimp::IFCImporter>::LogDebug
              ("generating CSG geometry by plane clipping (IfcBooleanClippingResult)");
  }
  return;
}

Assistant:

void ProcessBooleanHalfSpaceDifference(const Schema_2x3::IfcHalfSpaceSolid* hs, TempMesh& result,
    const TempMesh& first_operand,
    ConversionData& /*conv*/)
{
    ai_assert(hs != NULL);

    const Schema_2x3::IfcPlane* const plane = hs->BaseSurface->ToPtr<Schema_2x3::IfcPlane>();
    if(!plane) {
        IFCImporter::LogError("expected IfcPlane as base surface for the IfcHalfSpaceSolid");
        return;
    }

    // extract plane base position vector and normal vector
    IfcVector3 p,n(0.f,0.f,1.f);
    if (plane->Position->Axis) {
        ConvertDirection(n,plane->Position->Axis.Get());
    }
    ConvertCartesianPoint(p,plane->Position->Location);

    if(!IsTrue(hs->AgreementFlag)) {
        n *= -1.f;
    }

    // clip the current contents of `meshout` against the plane we obtained from the second operand
    const std::vector<IfcVector3>& in = first_operand.mVerts;
    std::vector<IfcVector3>& outvert = result.mVerts;

    std::vector<unsigned int>::const_iterator begin = first_operand.mVertcnt.begin(),
        end = first_operand.mVertcnt.end(), iit;

    outvert.reserve(in.size());
    result.mVertcnt.reserve(first_operand.mVertcnt.size());

    unsigned int vidx = 0;
    for(iit = begin; iit != end; vidx += *iit++) {

        unsigned int newcount = 0;
        bool isAtWhiteSide = (in[vidx] - p) * n > -1e-6;
        for( unsigned int i = 0; i < *iit; ++i ) {
            const IfcVector3& e0 = in[vidx + i], e1 = in[vidx + (i + 1) % *iit];

            // does the next segment intersect the plane?
            IfcVector3 isectpos;
            if( IntersectSegmentPlane(p, n, e0, e1, isAtWhiteSide, isectpos) ) {
                if( isAtWhiteSide ) {
                    // e0 is on the right side, so keep it
                    outvert.push_back(e0);
                    outvert.push_back(isectpos);
                    newcount += 2;
                }
                else {
                    // e0 is on the wrong side, so drop it and keep e1 instead
                    outvert.push_back(isectpos);
                    ++newcount;
                }
                isAtWhiteSide = !isAtWhiteSide;
            }
            else
            {
                if( isAtWhiteSide ) {
                    outvert.push_back(e0);
                    ++newcount;
                }
            }
        }

        if (!newcount) {
            continue;
        }

        IfcVector3 vmin,vmax;
        ArrayBounds(&*(outvert.end()-newcount),newcount,vmin,vmax);

        // filter our IfcFloat points - those may happen if a point lies
        // directly on the intersection line. However, due to IfcFloat
        // precision a bitwise comparison is not feasible to detect
        // this case.
        const IfcFloat epsilon = (vmax-vmin).SquareLength() / 1e6f;
        FuzzyVectorCompare fz(epsilon);

        std::vector<IfcVector3>::iterator e = std::unique( outvert.end()-newcount, outvert.end(), fz );

        if (e != outvert.end()) {
            newcount -= static_cast<unsigned int>(std::distance(e,outvert.end()));
            outvert.erase(e,outvert.end());
        }
        if (fz(*( outvert.end()-newcount),outvert.back())) {
            outvert.pop_back();
            --newcount;
        }
        if(newcount > 2) {
            result.mVertcnt.push_back(newcount);
        }
        else while(newcount-->0) {
            result.mVerts.pop_back();
        }

    }
    IFCImporter::LogDebug("generating CSG geometry by plane clipping (IfcBooleanClippingResult)");
}